

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall
merlin::graph::triangulate
          (graph *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *ordering)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pmVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  size_type __n;
  unsigned_long uVar8;
  pointer peVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmp;
  index ni;
  vector<unsigned_long,_std::allocator<unsigned_long>_> position;
  void *local_88;
  iterator iStack_80;
  unsigned_long *local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_70;
  long local_68;
  long local_60;
  ulong local_58;
  index local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  puVar1 = (ordering->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (ordering->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar2 - (long)puVar1 >> 3;
  local_70 = ordering;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,__n,(allocator_type *)&local_88);
  if (puVar2 != puVar1) {
    puVar3 = (local_70->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[puVar3[uVar8]] = uVar8;
      uVar8 = uVar8 + 1;
    } while (__n + (__n == 0) != uVar8);
  }
  if (puVar2 != puVar1) {
    local_68 = __n + (__n == 0);
    lVar11 = 0;
    do {
      uVar8 = (local_70->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      uVar6 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      pmVar4 = (this->m_adj).
               super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = (void *)0x0;
      iStack_80._M_current = (unsigned_long *)0x0;
      local_78 = (unsigned_long *)0x0;
      peVar9 = *(pointer *)
                &pmVar4[uVar8].super_my_vector<merlin::edge_id>.
                 super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
      if (peVar9 != *(pointer *)
                     ((long)&pmVar4[uVar8].super_my_vector<merlin::edge_id>.
                             super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8)) {
        do {
          local_50 = peVar9->second;
          if (uVar6 < local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_50]) {
            if (iStack_80._M_current == local_78) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,iStack_80,
                         &local_50);
            }
            else {
              *iStack_80._M_current = local_50;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
          peVar9 = peVar9 + 1;
        } while (peVar9 != *(pointer *)
                            ((long)&pmVar4[uVar8].super_my_vector<merlin::edge_id>.
                                    super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>
                            + 8));
      }
      uVar5 = (uint)((ulong)((long)iStack_80._M_current - (long)local_88) >> 3);
      local_60 = lVar11;
      if (1 < (int)uVar5) {
        local_58 = (ulong)(uVar5 - 1);
        uVar12 = 1;
        uVar6 = 0;
        do {
          uVar7 = uVar6 + 1;
          uVar10 = uVar12;
          do {
            add_edge(this,*(index *)((long)local_88 + uVar6 * 8),
                     *(index *)((long)local_88 + uVar10 * 8));
            uVar10 = uVar10 + 1;
          } while ((uVar5 & 0x7fffffff) != uVar10);
          uVar12 = uVar12 + 1;
          uVar6 = uVar7;
        } while (uVar7 != local_58);
      }
      if (local_88 != (void *)0x0) {
        operator_delete(local_88);
      }
      lVar11 = local_60 + 1;
    } while (lVar11 != local_68);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void graph::triangulate(const std::vector<size_t>& ordering) {

	// set the position map
	size_t n = ordering.size();
	std::vector<size_t> position(n);
	for (size_t i = 0; i < n; ++i) {
		position[ordering[i]] = i;
	}

	// triangulate the graph
	for (size_t i = 0; i < n; ++i) {
		size_t var = ordering[i];
		size_t pos = position[var];

		const my_set<edge_id>& ns = neighbors(var);
		std::vector<size_t> tmp;
		for (my_set<edge_id>::const_iterator si = ns.begin(); si != ns.end(); ++si) {
			index ni = (*si).second;
			if (position[ni] > pos) {
				tmp.push_back(ni);
			}
		}

		// connect the earlier neighbors
		int m = (int)tmp.size();
		for (int j = 0; j < m-1; ++j) {
			for (int k = j+1; k < m; ++k) {
				add_edge(tmp[j], tmp[k]);
			}
		}
	}
}